

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectRazorAHRSx(RAZORAHRS *pRazorAHRS,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  RAZORAHRS *pRazorAHRS_local;
  
  local_24 = 0;
  do {
    if (addrsRazorAHRS[local_24] == (void *)0x0) {
      iVar1 = ConnectRazorAHRS(pRazorAHRS,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsRazorAHRS[local_24] = pRazorAHRS;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectRazorAHRSx(RAZORAHRS* pRazorAHRS, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectRazorAHRS(pRazorAHRS, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsRazorAHRS[id] = pRazorAHRS;

	return EXIT_SUCCESS;
}